

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::i2p_alert::~i2p_alert(i2p_alert *this)

{
  i2p_alert *this_local;
  
  ~i2p_alert(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

struct TORRENT_EXPORT i2p_alert final : alert
	{
		// internal
		i2p_alert(aux::stack_allocator& alloc, error_code const& ec);

		TORRENT_DEFINE_ALERT(i2p_alert, 77)

		static constexpr alert_category_t static_category = alert_category::error;
		std::string message() const override;

		// the error that occurred in the i2p SAM connection
		error_code error;
	}